

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

N_Vector * N_VCloneVectorArray(int count,N_Vector w)

{
  SUNContext sunctx;
  SUNErrCode SVar1;
  N_Vector *vs;
  N_Vector p_Var2;
  ulong uVar3;
  
  sunctx = w->sunctx;
  vs = (N_Vector *)malloc((long)count * 8);
  if (0 < count) {
    uVar3 = 0;
    do {
      p_Var2 = (*w->ops->nvclone)(w);
      if (p_Var2 != (N_Vector)0x0) {
        p_Var2->sunctx = w->sunctx;
      }
      vs[uVar3] = p_Var2;
      SVar1 = SUNContext_PeekLastError(sunctx);
      if (SVar1 < 0) {
        N_VDestroyVectorArray(vs,(int)uVar3 + -1);
        return (N_Vector *)0x0;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)count != uVar3);
  }
  return vs;
}

Assistant:

N_Vector* N_VCloneVectorArray(int count, N_Vector w)
{
  SUNFunctionBegin(w->sunctx);
  int j;
  N_Vector* vs = NULL;

  SUNAssertNull(count > 0, SUN_ERR_ARG_OUTOFRANGE);

  vs = (N_Vector*)malloc(count * sizeof(N_Vector));
  SUNAssertNull(vs, SUN_ERR_MALLOC_FAIL);

  for (j = 0; j < count; j++)
  {
    vs[j] = N_VClone(w);
    SUNCheckLastErrNoRet();
    if (SUNContext_PeekLastError(SUNCTX_) < 0)
    {
      N_VDestroyVectorArray(vs, j - 1);
      return (NULL);
    }
  }

  return (vs);
}